

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::refreshSingleLine(Cmd *this,State *state)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pcVar4;
  size_type sVar5;
  ulong uVar6;
  string ab;
  char seq [64];
  string local_98;
  char local_78 [72];
  
  sVar1 = (this->prompt)._M_string_length;
  pcVar4 = (state->buf)._M_dataplus._M_p;
  sVar5 = (state->buf)._M_string_length;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  uVar2 = state->cols;
  uVar6 = state->pos + sVar1;
  uVar3 = uVar6;
  if (uVar2 <= uVar6) {
    uVar3 = uVar2 - 1;
    if (uVar6 - 1 < uVar2 - 1) {
      uVar3 = uVar6 - 1;
    }
    sVar5 = (sVar5 + uVar3) - uVar6;
    pcVar4 = pcVar4 + (uVar6 - uVar3);
  }
  uVar6 = sVar5 + sVar1;
  if (uVar2 < sVar5 + sVar1) {
    uVar6 = uVar2;
  }
  std::__cxx11::string::append((char *)&local_98);
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)(this->prompt)._M_dataplus._M_p);
  if (state->mask_mode == true) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)&local_98,local_98._M_string_length,0,(char)uVar6 - (char)sVar1);
  }
  else {
    std::__cxx11::string::append((char *)&local_98,(ulong)pcVar4);
  }
  refreshShowHints(this,&local_98,state,(int)sVar1);
  std::__cxx11::string::append((char *)&local_98);
  snprintf(local_78,0x40,"\r\x1b[%dC",uVar3 & 0xffffffff);
  std::__cxx11::string::append((char *)&local_98);
  write(this->out_fd_,local_98._M_dataplus._M_p,local_98._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void refreshSingleLine(State *state) {
		char seq[64];
		const size_t plen = prompt.size();
		std::string_view buf_view(state->buf);
		size_t pos = state->pos;
		std::string ab;

		while (plen + pos >= state->cols) {
			buf_view.remove_prefix(1);
			pos--;
		}

		while (plen + buf_view.size() > state->cols) {
			buf_view.remove_suffix(1);
		}

		// Cursor to left edge
		ab.append("\r");

		// Write the prompt and the current buffer content
		ab.append(prompt);

		if (state->mask_mode) {
			ab.append(buf_view.size(), '*');
		} else {
			ab.append(buf_view);
		}
		// Show hits if any.
		refreshShowHints(ab, state, plen);

		// Erase to right
		ab.append("\x1b[0K");

		// Move cursor to original position.
		snprintf(seq, sizeof(seq), "\r\x1b[%dC", static_cast<int>(pos + plen));
		ab.append(seq);

		write_string(ab);
	}